

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O3

void __thiscall
Function::Function(Function *this,Function *left,Function *right,Function *plus,FunctionType type)

{
  double dVar1;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Function_0015c0b8;
  (this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sName)._M_dataplus._M_p = (pointer)&(this->sName).field_2;
  (this->sName)._M_string_length = 0;
  (this->sName).field_2._M_local_buf[0] = '\0';
  this->oLog = (ostream *)&std::cout;
  this->eType = EMPTY;
  this->xSrc = (double *)0x0;
  this->xLeft = (Function *)0x0;
  this->xRight = (Function *)0x0;
  this->xPlus = (Function *)0x0;
  this->xTable = (Matrix *)0x0;
  this->xFunction = 0;
  *(undefined8 *)&this->field_0xd0 = 0;
  this->dValue = 0.0;
  this->dLastValue = 0.0;
  this->dXMin = -10.0;
  this->dXMax = 10.0;
  this->dXStep = 0.1;
  this->dYMin = -10.0;
  this->dYMax = 10.0;
  this->dYStep = 0.1;
  this->bValueValid = false;
  this->bVerbose = false;
  this->functionUseCount = 0;
  this->dYInput = 0.0;
  this->dNextYInput = 0.0;
  this->dXInput = 0.0;
  this->dNextXInput = 0.0;
  this->xLeft = left;
  this->xRight = right;
  this->xPlus = plus;
  dVar1 = right->dXMax;
  this->dXMin = right->dXMin;
  this->dXMax = dVar1;
  dVar1 = right->dYMin;
  this->dXStep = right->dXStep;
  this->dYMin = dVar1;
  dVar1 = right->dYStep;
  this->dYMax = right->dYMax;
  this->dYStep = dVar1;
  setType(this,type);
  return;
}

Assistant:

Function::Function( Function& left, Function& right, Function& plus, FunctionType type )
{
	init();
	xLeft = &left;
	xRight = &right;
	xPlus = &plus;
	dXMin = right.dXMin;
	dXMax = right.dXMax;
	dXStep = right.dXStep;
	dYMin = right.dYMin;
	dYMax = right.dYMax;
	dYStep = right.dYStep;
	setType(type);
}